

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O3

normal3f tinyusdz::vcross(normal3f *a,normal3f *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  normal3f nVar5;
  
  uVar1 = a->y;
  uVar3 = a->z;
  uVar2 = b->y;
  uVar4 = b->z;
  nVar5.x = (float)uVar4 * (float)uVar1 - (float)uVar3 * (float)uVar2;
  nVar5.y = b->x * (float)uVar3 - a->x * (float)uVar4;
  nVar5.z = a->x * (float)uVar2 - b->x * (float)uVar1;
  return nVar5;
}

Assistant:

float operator[](size_t idx) const { return *(&x + idx); }